

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio_utils.cpp
# Opt level: O0

bool emptystr(string *input,string *comments)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  regex emptyregex;
  string *comments_local;
  string *input_local;
  
  emptyregex._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)comments;
  std::operator+(&local_78,"^\\s*[",comments);
  std::operator+(&local_58,&local_78,"]+.*\\n*$|^\\s*\\n*$");
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_38,&local_58,0x10);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (input,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_38,0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_38);
  return bVar1;
}

Assistant:

bool emptystr(const string& input, const string& comments) {
  const regex emptyregex(R"(^\s*[)"+comments+R"(]+.*\n*$|^\s*\n*$)");
  return regex_match(input, emptyregex);
}